

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

void __thiscall GraphBuilder::printEdges(GraphBuilder *this,ostream *ostream)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->llvmToNodeMap_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0
      ; p_Var1 = p_Var1->_M_nxt) {
    (*(code *)(p_Var1[2]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var1[2]._M_nxt,ostream);
  }
  for (p_Var1 = (this->artificialNodes_)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    (*(code *)(p_Var1[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var1[1]._M_nxt,ostream);
  }
  return;
}

Assistant:

void GraphBuilder::printEdges(std::ostream &ostream) const {
    for (const auto &iterator : llvmToNodeMap_) {
        iterator.second->printOutcomingEdges(ostream);
    }
    for (const auto &iterator : artificialNodes_) {
        iterator->printOutcomingEdges(ostream);
    }
}